

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ll_ifc.c
# Opt level: O2

int32_t ll_firmware_type_get(ll_firmware_type_t *t)

{
  _Bool _Var1;
  int32_t iVar2;
  
  if (t == (ll_firmware_type_t *)0x0) {
    iVar2 = -0x65;
  }
  else {
    _Var1 = transport_mutex_grab();
    if (_Var1) {
      iVar2 = hal_read_write(OP_FIRMWARE_TYPE,(uint8_t *)0x0,0,_ll_ifc_msg_buff,4);
      transport_mutex_release();
      if (iVar2 != 0) {
        if (iVar2 == 4) {
          t->cpu_code = _ll_ifc_msg_buff._0_2_ << 8 | (ushort)_ll_ifc_msg_buff._0_2_ >> 8;
          t->functionality_code = _ll_ifc_msg_buff._2_2_ << 8 | (ushort)_ll_ifc_msg_buff._2_2_ >> 8;
          iVar2 = 0;
        }
        else {
          iVar2 = -0x66;
        }
      }
    }
    else {
      iVar2 = -0x71;
    }
  }
  return iVar2;
}

Assistant:

int32_t ll_firmware_type_get(ll_firmware_type_t *t)
{

    int32_t ret;
    if(NULL == t)
    {
        return LL_IFC_ERROR_INCORRECT_PARAMETER;
    }

    if (!(transport_mutex_grab()))
    {
        return LL_IFC_ERROR_HAL_CALL_FAILED;
    }

    ret = hal_read_write(OP_FIRMWARE_TYPE, NULL, 0, &_ll_ifc_msg_buff[0], FIRMWARE_TYPE_LEN);
    transport_mutex_release();

    if (ret == 0)
    {
        //return ret;
    }
    else if(FIRMWARE_TYPE_LEN != ret)
    {
        ret = LL_IFC_ERROR_INCORRECT_RESPONSE_LENGTH;
    }
    else
    {
        t->cpu_code = _ll_ifc_msg_buff[0] << 8 | _ll_ifc_msg_buff[1];
        t->functionality_code = _ll_ifc_msg_buff[2] << 8 | _ll_ifc_msg_buff[3];
    }

    return (ret >= 0) ? LL_IFC_ACK : ret;
}